

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O3

void __thiscall wasm::OptimizeInstructions::visitUnary(OptimizeInstructions *this,Unary *curr)

{
  undefined1 uVar1;
  bool bVar2;
  Id IVar3;
  UnaryOp UVar4;
  BinaryOp BVar5;
  Index IVar6;
  BinaryOp BVar7;
  uint uVar8;
  UnaryOp UVar9;
  ulong uVar10;
  Unary *curr_00;
  Const *right;
  Binary *rep;
  Expression *pEVar11;
  anon_union_16_6_1532cd5a_for_Literal_0 *this_00;
  OptimizeInstructions *this_01;
  Type *this_02;
  undefined8 local_f8 [2];
  Literal local_e8;
  anon_union_16_6_1532cd5a_for_Literal_0 local_d0;
  undefined8 *local_c0;
  undefined1 *local_b8;
  undefined1 local_a8 [8];
  Builder builder;
  anon_union_16_6_1532cd5a_for_Literal_0 local_68;
  anon_union_16_6_1532cd5a_for_Literal_0 *local_58;
  Unary *local_48;
  Binary *inner;
  HeapType local_38;
  Const *c;
  
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id == 1) {
    return;
  }
  if (((((curr->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id == UnaryId)
       && (UVar9 = curr->op,
          UVar4 = Match::Internal::AbstractUnaryOpK::getOp((Type)(curr->value->type).id,EqZ),
          UVar9 == UVar4)) && (pEVar11 = curr->value, pEVar11->_id == BinaryId)) &&
     (BVar7 = *(BinaryOp *)(pEVar11 + 1),
     BVar5 = Abstract::getBinary((Type)*(uintptr_t *)(pEVar11[1].type.id + 8),Sub), BVar7 == BVar5))
  {
    uVar10 = *(ulong *)(pEVar11[1].type.id + 8);
    if (uVar10 < 7) {
      *(undefined4 *)(pEVar11 + 1) = *(undefined4 *)(&DAT_00df9190 + uVar10 * 4);
      (pEVar11->type).id = 2;
      replaceCurrent(this,pEVar11);
      return;
    }
    goto LAB_009cfa4b;
  }
  local_f8[0] = 0;
  local_a8 = (undefined1  [8])&stack0xffffffffffffffc8;
  local_d0._8_4_ = 3;
  local_68.i64 = 0;
  local_68._8_4_ = 0x13;
  local_d0.i64 = (int64_t)(element_type *)&local_48;
  local_c0 = local_f8;
  local_b8 = local_a8;
  local_58 = &local_d0;
  inner = (Binary *)this;
  bVar2 = Match::Internal::
          Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&>
          ::matches((Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&>
                     *)&local_68.func,
                    (candidate_t<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>_>
                     )curr);
  if (bVar2) {
    Literal::neg((Literal *)local_a8,(Literal *)(local_38.id + 0x10));
    Literal::operator=((Literal *)(local_38.id + 0x10),(Literal *)local_a8);
    this_01 = (OptimizeInstructions *)inner;
    Literal::~Literal((Literal *)local_a8);
    if (6 < *(ulong *)(local_38.id + 8)) goto LAB_009cfa4b;
    local_48->op = *(UnaryOp *)(&DAT_00df9190 + *(ulong *)(local_38.id + 8) * 4);
    (local_48->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id = 2;
    curr_00 = local_48;
    goto LAB_009cfa34;
  }
  local_f8[0] = 0;
  local_a8 = (undefined1  [8])&stack0xffffffffffffffc8;
  local_d0._8_4_ = 9;
  local_68.i64 = 0;
  local_68._8_4_ = 0x13;
  local_d0._0_8_ = (element_type *)&local_48;
  local_c0 = local_f8;
  local_b8 = local_a8;
  local_58 = &local_d0;
  bVar2 = Match::Internal::
          Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&>
          ::matches((Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&>
                     *)&local_68.func,
                    (candidate_t<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>_>
                     )curr);
  this_01 = (OptimizeInstructions *)inner;
  if (bVar2) {
    bVar2 = Literal::isSignedMin((Literal *)(local_38.id + 0x10));
    this_01 = (OptimizeInstructions *)inner;
    if (bVar2) {
LAB_009cf4a2:
      if (6 < *(ulong *)(local_38.id + 8)) goto LAB_009cfa4b;
      local_48->op = *(UnaryOp *)(&DAT_00df9120 + *(ulong *)(local_38.id + 8) * 4);
      bVar2 = Literal::isSignedMin((Literal *)(local_38.id + 0x10));
      if (bVar2) {
        Literal::makeSignedMax((Literal *)local_a8,(Type)*(uintptr_t *)(local_38.id + 8));
        Literal::operator=((Literal *)(local_38.id + 0x10),(Literal *)local_a8);
        this_00 = (anon_union_16_6_1532cd5a_for_Literal_0 *)local_a8;
      }
      else {
        Literal::abs((Literal *)&local_d0.func,(int)local_38.id + 0x10);
        Literal::makeOne((Literal *)&local_68.func,(Type)*(uintptr_t *)(local_38.id + 8));
        Literal::sub((Literal *)local_a8,(Literal *)&local_d0.func,(Literal *)&local_68.func);
        Literal::operator=((Literal *)(local_38.id + 0x10),(Literal *)local_a8);
        Literal::~Literal((Literal *)local_a8);
        Literal::~Literal((Literal *)&local_68.func);
        this_00 = &local_d0;
      }
      Literal::~Literal((Literal *)&this_00->func);
      curr_00 = curr;
      goto LAB_009cfa34;
    }
    Literal::abs((Literal *)&local_68.func,(int)local_38.id + 0x10);
    uVar10 = Literal::getInteger((Literal *)&local_68.func);
    if (uVar10 == 0) {
      Literal::~Literal((Literal *)&local_68.func);
    }
    else {
      Literal::~Literal((Literal *)&local_68.func);
      if ((uVar10 & uVar10 - 1) == 0) goto LAB_009cf4a2;
    }
  }
  IVar3 = (curr->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id;
  if (IVar3 == UnaryId) {
    UVar9 = curr->op;
    if (UVar9 == WrapInt64) {
      curr_00 = (Unary *)optimizeWrappedResult(this_01,curr);
      if (curr_00 != (Unary *)0x0) goto LAB_009cfa34;
      IVar3 = (curr->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id;
      if (IVar3 != UnaryId) goto LAB_009cf61d;
      UVar9 = curr->op;
    }
    IVar3 = UnaryId;
    if (((UVar9 == EqZInt32) &&
        (curr_00 = (Unary *)curr->value,
        (curr_00->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id ==
        UnaryId)) && (curr_00->op == WrapInt64)) {
      IVar6 = Bits::getMaxBits<wasm::OptimizeInstructions>(curr_00->value,this_01);
      if (IVar6 < 0x21) {
        curr_00->op = EqZInt64;
        goto LAB_009cfa34;
      }
      IVar3 = (curr->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id;
    }
  }
LAB_009cf61d:
  if ((((this_01->
        super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
        ).super_Pass.runner)->options).shrinkLevel == 0) {
    if (IVar3 == UnaryId) {
      if ((curr->op == EqZInt32) && (pEVar11 = curr->value, pEVar11->_id == UnaryId)) {
        UVar9 = *(UnaryOp *)(pEVar11 + 1);
        UVar4 = Match::Internal::AbstractUnaryOpK::getOp
                          ((Type)*(uintptr_t *)(pEVar11[1].type.id + 8),EqZ);
        if (UVar9 == UVar4) {
          pEVar11 = (Expression *)pEVar11[1].type.id;
          local_a8 = (undefined1  [8])
                     (this_01->
                     super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                     ).
                     super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                     .
                     super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                     .currModule;
          BVar7 = Abstract::getBinary((Type)(pEVar11->type).id,Ne);
          Literal::makeZero(&local_e8,(Type)(pEVar11->type).id);
          right = Builder::makeConst((Builder *)local_a8,&local_e8);
          rep = Builder::makeBinary((Builder *)local_a8,BVar7,pEVar11,(Expression *)right);
          replaceCurrent((OptimizeInstructions *)inner,(Expression *)rep);
          Literal::~Literal(&local_e8);
          return;
        }
        IVar3 = (curr->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id;
        goto LAB_009cf627;
      }
      goto LAB_009cf6ec;
    }
  }
  else {
LAB_009cf627:
    if (IVar3 == UnaryId) {
LAB_009cf6ec:
      pEVar11 = curr->value;
      if (((pEVar11->_id == UnaryId) && (*(int *)(pEVar11 + 1) == 0x18)) &&
         (UVar9 = curr->op, (UVar9 & ~ClzInt64) == ExtendSInt32)) {
        curr_00 = (Unary *)pEVar11[1].type.id;
        IVar6 = Bits::getMaxBits<wasm::OptimizeInstructions>((Expression *)curr_00,this_01);
        if (((UVar9 == ExtendSInt32) && (IVar6 < 0x20)) ||
           ((UVar9 == ExtendUInt32 && (IVar6 < 0x21)))) goto LAB_009cfa34;
      }
    }
  }
  if ((((((((this_01->
            super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
            ).
            super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
            .
            super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
           .currModule)->features).features & 0x20) == 0) ||
       ((curr->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id != UnaryId))
      || (curr->op != ExtendSInt32)) ||
     ((curr_00 = (Unary *)curr->value,
      (curr_00->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id != UnaryId
      || (curr_00->op != WrapInt64)))) {
    curr_00 = (Unary *)curr->value;
    if (((curr->op & ~ClzInt64) != ExtendSInt32) ||
       ((curr_00->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id != LoadId
       )) {
LAB_009cf7bd:
      IVar6 = getSignExtBits(this_01,(Expression *)curr_00);
      UVar9 = curr->op;
      if (IVar6 != 0) {
        if (8 < IVar6 || UVar9 != ExtendS8Int32) {
          if (((8 < IVar6 || UVar9 != ExtendS8Int64) &&
              (0x10 < IVar6 || (UVar9 & ~CtzInt32) != ExtendS16Int32)) &&
             (0x20 < IVar6 || UVar9 != ExtendS32Int64)) goto LAB_009cf824;
        }
        curr_00 = (Unary *)curr->value;
        goto LAB_009cfa34;
      }
LAB_009cf824:
      if ((UVar9 < ExtendS8Int32) && ((0x600600000000U >> ((ulong)UVar9 & 0x3f) & 1) != 0)) {
        this_02 = &(curr->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type;
        curr_00 = (Unary *)curr->value;
        IVar3 = (curr_00->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id;
        if (IVar3 == LoadId) {
          if ((char)curr_00[1].super_SpecificExpression<(wasm::Expression::Id)15>.super_Expression.
                    type.id == '\0') {
            UVar9 = curr_00->op;
            uVar8 = wasm::Type::getByteSize(this_02);
            if (uVar8 == (byte)(char)UVar9) {
              (curr_00->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id
                   = this_02->id;
              goto LAB_009cfa34;
            }
            UVar9 = curr->op;
          }
        }
        else if (((IVar3 == UnaryId) && ((ulong)curr_00->op < 0x2f)) &&
                (((0x600600000000U >> ((ulong)curr_00->op & 0x3f) & 1) != 0 &&
                 (curr_00 = (Unary *)curr_00->value,
                 (curr_00->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type
                 .id == this_02->id)))) goto LAB_009cfa34;
      }
      if (UVar9 - AbsFloat32 < 2) {
        curr_00 = (Unary *)curr->value;
        IVar3 = (curr_00->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id;
        if (IVar3 == BinaryId) {
          UVar9 = curr_00->op;
          UVar4 = Abstract::getBinary((Type)(curr_00->
                                            super_SpecificExpression<(wasm::Expression::Id)15>).
                                            super_Expression.type.id,Mul);
          if (((UVar9 == UVar4) ||
              (UVar9 = curr_00->op,
              UVar4 = Abstract::getBinary((Type)(curr_00->
                                                super_SpecificExpression<(wasm::Expression::Id)15>).
                                                super_Expression.type.id,DivS), UVar9 == UVar4)) &&
             (bVar2 = areConsecutiveInputsEqual
                                (this_01,curr_00->value,
                                 *(Expression **)
                                  &curr_00[1].super_SpecificExpression<(wasm::Expression::Id)15>.
                                   super_Expression), bVar2)) goto LAB_009cfa34;
          if (((this_01->fastMath == true) &&
              (UVar9 = curr_00->op,
              UVar4 = Abstract::getBinary((Type)(curr_00->
                                                super_SpecificExpression<(wasm::Expression::Id)15>).
                                                super_Expression.type.id,Sub), UVar9 == UVar4)) &&
             ((curr_00->value->_id == ConstId &&
              (bVar2 = Literal::isZero((Literal *)(curr_00->value + 1)), bVar2)))) {
            pEVar11 = *(Expression **)
                       &curr_00[1].super_SpecificExpression<(wasm::Expression::Id)15>.
                        super_Expression;
            goto LAB_009cf964;
          }
        }
        else if (IVar3 == UnaryId) {
          uVar10 = (curr_00->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.
                   type.id;
          if (6 < uVar10) {
LAB_009cfa4b:
            __assert_fail("isBasic() && \"Basic type expected\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                          ,0x1c4,"BasicType wasm::Type::getBasic() const");
          }
          if (curr_00->op == *(UnaryOp *)(&DAT_00df8e7c + uVar10 * 4)) {
            pEVar11 = curr_00->value;
            goto LAB_009cf964;
          }
        }
      }
      else if (UVar9 == EqZInt32) {
        curr_00 = (Unary *)curr->value;
        if ((curr_00->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id ==
            BinaryId) {
          UVar9 = invertBinaryOp(this_01,curr_00->op);
          if (UVar9 != (TruncSatZeroSVecF64x2ToVecI32x4|FloorVecF16x8)) {
            curr_00->op = UVar9;
            goto LAB_009cfa34;
          }
          curr_00 = (Unary *)curr->value;
        }
        pEVar11 = Properties::getSignExtValue((Expression *)curr_00);
        if (pEVar11 != (Expression *)0x0) {
          IVar6 = Properties::getSignExtBits(curr->value);
          pEVar11 = makeZeroExt(this_01,pEVar11,IVar6);
LAB_009cf964:
          curr->value = pEVar11;
          curr_00 = curr;
          goto LAB_009cfa34;
        }
      }
      curr_00 = (Unary *)deduplicateUnary(this_01,curr);
      if (((curr_00 == (Unary *)0x0) &&
          (curr_00 = (Unary *)simplifyRoundingsAndConversions(this_01,curr), curr_00 == (Unary *)0x0
          )) && (curr_00 = (Unary *)replaceZeroBitsWithZero(this_01,(Expression *)curr),
                curr_00 == (Unary *)0x0)) {
        return;
      }
      goto LAB_009cfa34;
    }
    uVar1 = (undefined1)curr_00->op;
    if (curr->op == ExtendSInt32) {
      if (uVar1 == PopcntInt32) {
        if ((char)curr_00[1].super_SpecificExpression<(wasm::Expression::Id)15>.super_Expression.
                  type.id != '\0') goto LAB_009cf7bd;
        *(byte *)((long)&curr_00->op + 1) = 1;
      }
    }
    else if (((byte)uVar1 < CtzInt64) && (*(byte *)((long)&curr_00->op + 1) != 0))
    goto LAB_009cf7bd;
  }
  else {
    curr_00->op = ExtendS32Int64;
  }
  (curr_00->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id = 3;
LAB_009cfa34:
  replaceCurrent(this_01,(Expression *)curr_00);
  return;
}

Assistant:

void visitUnary(Unary* curr) {
    if (curr->type == Type::unreachable) {
      return;
    }

    {
      using namespace Match;
      using namespace Abstract;
      Builder builder(*getModule());
      {
        // eqz(x - y)  =>  x == y
        Binary* inner;
        if (matches(curr, unary(EqZ, binary(&inner, Sub, any(), any())))) {
          inner->op = Abstract::getBinary(inner->left->type, Eq);
          inner->type = Type::i32;
          return replaceCurrent(inner);
        }
      }
      {
        // eqz(x + C)  =>  x == -C
        Const* c;
        Binary* inner;
        if (matches(curr, unary(EqZ, binary(&inner, Add, any(), ival(&c))))) {
          c->value = c->value.neg();
          inner->op = Abstract::getBinary(c->type, Eq);
          inner->type = Type::i32;
          return replaceCurrent(inner);
        }
      }
      {
        // eqz((signed)x % C_pot)  =>  eqz(x & (abs(C_pot) - 1))
        Const* c;
        Binary* inner;
        if (matches(curr, unary(EqZ, binary(&inner, RemS, any(), ival(&c)))) &&
            (c->value.isSignedMin() ||
             Bits::isPowerOf2(c->value.abs().getInteger()))) {
          inner->op = Abstract::getBinary(c->type, And);
          if (c->value.isSignedMin()) {
            c->value = Literal::makeSignedMax(c->type);
          } else {
            c->value = c->value.abs().sub(Literal::makeOne(c->type));
          }
          return replaceCurrent(curr);
        }
      }
      {
        // i32.wrap_i64 can be removed if the operations inside it do not
        // actually require 64 bits, e.g.:
        //
        // i32.wrap_i64(i64.extend_i32_u(x))  =>  x
        if (matches(curr, unary(WrapInt64, any()))) {
          if (auto* ret = optimizeWrappedResult(curr)) {
            return replaceCurrent(ret);
          }
        }
      }
      {
        // i32.eqz(i32.wrap_i64(x))  =>  i64.eqz(x)
        //   where maxBits(x) <= 32
        Unary* inner;
        Expression* x;
        if (matches(curr, unary(EqZInt32, unary(&inner, WrapInt64, any(&x)))) &&
            Bits::getMaxBits(x, this) <= 32) {
          inner->op = EqZInt64;
          return replaceCurrent(inner);
        }
      }
      {
        // i32.eqz(i32.eqz(x))  =>  i32(x) != 0
        // i32.eqz(i64.eqz(x))  =>  i64(x) != 0
        //   iff shinkLevel == 0
        // (1 instruction instead of 2, but 1 more byte)
        if (getPassRunner()->options.shrinkLevel == 0) {
          Expression* x;
          if (matches(curr, unary(EqZInt32, unary(EqZ, any(&x))))) {
            Builder builder(*getModule());
            return replaceCurrent(builder.makeBinary(
              getBinary(x->type, Ne),
              x,
              builder.makeConst(Literal::makeZero(x->type))));
          }
        }
      }
      {
        // i64.extend_i32_s(i32.wrap_i64(x))  =>  x
        //   where maxBits(x) <= 31
        //
        // i64.extend_i32_u(i32.wrap_i64(x))  =>  x
        //   where maxBits(x) <= 32
        Expression* x;
        UnaryOp unaryOp;
        if (matches(curr, unary(&unaryOp, unary(WrapInt64, any(&x))))) {
          if (unaryOp == ExtendSInt32 || unaryOp == ExtendUInt32) {
            auto maxBits = Bits::getMaxBits(x, this);
            if ((unaryOp == ExtendSInt32 && maxBits <= 31) ||
                (unaryOp == ExtendUInt32 && maxBits <= 32)) {
              return replaceCurrent(x);
            }
          }
        }
      }
      if (getModule()->features.hasSignExt()) {
        // i64.extend_i32_s(i32.wrap_i64(x))  =>  i64.extend32_s(x)
        Unary* inner;
        if (matches(curr,
                    unary(ExtendSInt32, unary(&inner, WrapInt64, any())))) {
          inner->op = ExtendS32Int64;
          inner->type = Type::i64;
          return replaceCurrent(inner);
        }
      }
    }

    if (curr->op == ExtendUInt32 || curr->op == ExtendSInt32) {
      if (auto* load = curr->value->dynCast<Load>()) {
        // i64.extend_i32_s(i32.load(_8|_16)(_u|_s)(x))  =>
        //    i64.load(_8|_16|_32)(_u|_s)(x)
        //
        // i64.extend_i32_u(i32.load(_8|_16)(_u|_s)(x))  =>
        //    i64.load(_8|_16|_32)(_u|_s)(x)
        //
        // but we can't do this in following cases:
        //
        //    i64.extend_i32_u(i32.load8_s(x))
        //    i64.extend_i32_u(i32.load16_s(x))
        //
        // this mixed sign/zero extensions can't represent in single
        // signed or unsigned 64-bit load operation. For example if `load8_s(x)`
        // return i8(-1) (0xFF) than sign extended result will be
        // i32(-1) (0xFFFFFFFF) and with zero extension to i64 we got
        // finally 0x00000000FFFFFFFF. However with `i64.load8_s` in this
        // situation we got `i64(-1)` (all ones) and with `i64.load8_u` it
        // will be 0x00000000000000FF.
        //
        // Another limitation is atomics which only have unsigned loads.
        // So we also avoid this only case:
        //
        //   i64.extend_i32_s(i32.atomic.load(x))

        // Special case for i32.load. In this case signedness depends on
        // extend operation.
        bool willBeSigned = curr->op == ExtendSInt32 && load->bytes == 4;
        if (!(curr->op == ExtendUInt32 && load->bytes <= 2 && load->signed_) &&
            !(willBeSigned && load->isAtomic)) {
          if (willBeSigned) {
            load->signed_ = true;
          }
          load->type = Type::i64;
          return replaceCurrent(load);
        }
      }
    }

    // Simple sign extends can be removed if the value is already sign-extended.
    auto signExtBits = getSignExtBits(curr->value);
    if (signExtBits > 0) {
      // Note that we can handle the case of |curr| having a larger sign-extend:
      // if we have an 8-bit value in 32-bit, then there are 24 sign bits, and
      // doing a sign-extend to 16 will only affect 16 of those 24, and the
      // effect is to leave them as they are.
      if ((curr->op == ExtendS8Int32 && signExtBits <= 8) ||
          (curr->op == ExtendS16Int32 && signExtBits <= 16) ||
          (curr->op == ExtendS8Int64 && signExtBits <= 8) ||
          (curr->op == ExtendS16Int64 && signExtBits <= 16) ||
          (curr->op == ExtendS32Int64 && signExtBits <= 32)) {
        return replaceCurrent(curr->value);
      }
    }

    if (Abstract::hasAnyReinterpret(curr->op)) {
      // i32.reinterpret_f32(f32.reinterpret_i32(x))  =>  x
      // i64.reinterpret_f64(f64.reinterpret_i64(x))  =>  x
      // f32.reinterpret_i32(i32.reinterpret_f32(x))  =>  x
      // f64.reinterpret_i64(i64.reinterpret_f64(x))  =>  x
      if (auto* inner = curr->value->dynCast<Unary>()) {
        if (Abstract::hasAnyReinterpret(inner->op)) {
          if (inner->value->type == curr->type) {
            return replaceCurrent(inner->value);
          }
        }
      }
      // f32.reinterpret_i32(i32.load(x))  =>  f32.load(x)
      // f64.reinterpret_i64(i64.load(x))  =>  f64.load(x)
      // i32.reinterpret_f32(f32.load(x))  =>  i32.load(x)
      // i64.reinterpret_f64(f64.load(x))  =>  i64.load(x)
      if (auto* load = curr->value->dynCast<Load>()) {
        if (!load->isAtomic && load->bytes == curr->type.getByteSize()) {
          load->type = curr->type;
          return replaceCurrent(load);
        }
      }
    }

    if (curr->op == EqZInt32) {
      if (auto* inner = curr->value->dynCast<Binary>()) {
        // Try to invert a relational operation using De Morgan's law
        auto op = invertBinaryOp(inner->op);
        if (op != InvalidBinary) {
          inner->op = op;
          return replaceCurrent(inner);
        }
      }
      // eqz of a sign extension can be of zero-extension
      if (auto* ext = Properties::getSignExtValue(curr->value)) {
        // we are comparing a sign extend to a constant, which means we can
        // use a cheaper zext
        auto bits = Properties::getSignExtBits(curr->value);
        curr->value = makeZeroExt(ext, bits);
        return replaceCurrent(curr);
      }
    } else if (curr->op == AbsFloat32 || curr->op == AbsFloat64) {
      // abs(-x)   ==>   abs(x)
      if (auto* unaryInner = curr->value->dynCast<Unary>()) {
        if (unaryInner->op ==
            Abstract::getUnary(unaryInner->type, Abstract::Neg)) {
          curr->value = unaryInner->value;
          return replaceCurrent(curr);
        }
      }
      // abs(x * x)   ==>   x * x
      // abs(x / x)   ==>   x / x
      if (auto* binary = curr->value->dynCast<Binary>()) {
        if ((binary->op == Abstract::getBinary(binary->type, Abstract::Mul) ||
             binary->op == Abstract::getBinary(binary->type, Abstract::DivS)) &&
            areConsecutiveInputsEqual(binary->left, binary->right)) {
          return replaceCurrent(binary);
        }
        // abs(0 - x)   ==>   abs(x),
        // only for fast math
        if (fastMath &&
            binary->op == Abstract::getBinary(binary->type, Abstract::Sub)) {
          if (auto* c = binary->left->dynCast<Const>()) {
            if (c->value.isZero()) {
              curr->value = binary->right;
              return replaceCurrent(curr);
            }
          }
        }
      }
    }

    if (auto* ret = deduplicateUnary(curr)) {
      return replaceCurrent(ret);
    }

    if (auto* ret = simplifyRoundingsAndConversions(curr)) {
      return replaceCurrent(ret);
    }

    if (auto* ret = replaceZeroBitsWithZero(curr)) {
      return replaceCurrent(ret);
    }
  }